

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O1

string * __thiscall
google::protobuf::TextFormat::FieldValuePrinter::PrintEnum
          (string *__return_storage_ptr__,FieldValuePrinter *this,int32_t val,string *name)

{
  StringBaseTextGenerator generator;
  _Alloc_hider local_38;
  size_type local_30;
  char local_28;
  undefined7 uStack_27;
  undefined8 uStack_20;
  
  local_30 = 0;
  local_28 = '\0';
  local_38._M_p = &local_28;
  std::__cxx11::string::append((char *)&local_38,(ulong)(name->_M_dataplus)._M_p);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if (local_38._M_p == &local_28) {
    (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_27,local_28);
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uStack_20;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = local_38._M_p;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_27,local_28);
  }
  __return_storage_ptr__->_M_string_length = local_30;
  return __return_storage_ptr__;
}

Assistant:

std::string TextFormat::FieldValuePrinter::PrintEnum(
    int32_t val, const std::string& name) const {
  FORWARD_IMPL(PrintEnum, val, name);
}